

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O2

int __thiscall agg::curve3_inc::init(curve3_inc *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  
  *(double *)(this + 0x10) = in_XMM0_Qa;
  *(double *)(this + 0x18) = in_XMM1_Qa;
  dVar8 = in_XMM2_Qa - in_XMM0_Qa;
  dVar9 = in_XMM3_Qa - in_XMM1_Qa;
  auVar5._0_8_ = dVar9 * dVar9;
  auVar5._8_8_ = (in_XMM5_Qa - in_XMM3_Qa) * (in_XMM5_Qa - in_XMM3_Qa);
  auVar6._8_8_ = (in_XMM4_Qa - in_XMM2_Qa) * (in_XMM4_Qa - in_XMM2_Qa) + auVar5._8_8_;
  auVar6._0_8_ = dVar8 * dVar8 + auVar5._0_8_;
  auVar6 = sqrtpd(auVar5,auVar6);
  *(double *)(this + 0x20) = in_XMM4_Qa;
  *(double *)(this + 0x28) = in_XMM5_Qa;
  iVar2 = (int)(long)((auVar6._0_8_ + auVar6._8_8_) * 0.25 * *(double *)(this + 8) + 0.5);
  iVar1 = 4;
  if (4 < iVar2) {
    iVar1 = iVar2;
  }
  *(int *)this = iVar1;
  dVar7 = 1.0 / (double)iVar1;
  *(double *)(this + 0x30) = in_XMM0_Qa;
  *(double *)(this + 0x60) = in_XMM0_Qa;
  *(double *)(this + 0x38) = in_XMM1_Qa;
  *(double *)(this + 0x68) = in_XMM1_Qa;
  dVar3 = dVar7 * dVar7 * (in_XMM4_Qa + (in_XMM0_Qa - (in_XMM2_Qa + in_XMM2_Qa)));
  dVar4 = dVar7 * dVar7 * (in_XMM5_Qa + (in_XMM1_Qa - (in_XMM3_Qa + in_XMM3_Qa)));
  dVar8 = (dVar7 + dVar7) * dVar8 + dVar3;
  dVar9 = (dVar7 + dVar7) * dVar9 + dVar4;
  *(double *)(this + 0x40) = dVar8;
  *(double *)(this + 0x48) = dVar9;
  *(double *)(this + 0x70) = dVar8;
  *(double *)(this + 0x78) = dVar9;
  *(double *)(this + 0x50) = dVar3 + dVar3;
  *(double *)(this + 0x58) = dVar4 + dVar4;
  *(int *)(this + 4) = iVar1;
  return iVar2;
}

Assistant:

void curve3_inc::init(double x1, double y1, 
                          double x2, double y2, 
                          double x3, double y3)
    {
        m_start_x = x1;
        m_start_y = y1;
        m_end_x   = x3;
        m_end_y   = y3;

        double dx1 = x2 - x1;
        double dy1 = y2 - y1;
        double dx2 = x3 - x2;
        double dy2 = y3 - y2;

        double len = sqrt(dx1 * dx1 + dy1 * dy1) + sqrt(dx2 * dx2 + dy2 * dy2); 

        m_num_steps = uround(len * 0.25 * m_scale);

        if(m_num_steps < 4)
        {
            m_num_steps = 4;   
        }

        double subdivide_step  = 1.0 / m_num_steps;
        double subdivide_step2 = subdivide_step * subdivide_step;

        double tmpx = (x1 - x2 * 2.0 + x3) * subdivide_step2;
        double tmpy = (y1 - y2 * 2.0 + y3) * subdivide_step2;

        m_saved_fx = m_fx = x1;
        m_saved_fy = m_fy = y1;
        
        m_saved_dfx = m_dfx = tmpx + (x2 - x1) * (2.0 * subdivide_step);
        m_saved_dfy = m_dfy = tmpy + (y2 - y1) * (2.0 * subdivide_step);

        m_ddfx = tmpx * 2.0;
        m_ddfy = tmpy * 2.0;

        m_step = m_num_steps;
    }